

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libntlmconnect.c
# Opt level: O2

int test(char *url)

{
  uint uVar1;
  bool bVar2;
  uint __i;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  CURL **ppCVar8;
  CURL *pCVar9;
  ulong uVar10;
  uint *puVar11;
  undefined8 uVar12;
  long lVar13;
  undefined8 uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  FILE *pFVar18;
  char cVar19;
  bool bVar20;
  timeval tVar21;
  curl_socket_t maxfd;
  int running;
  ulong local_1d8;
  char *local_1d0;
  long timeout;
  timeval interval;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  
  sVar6 = strlen(url);
  pcVar7 = (char *)malloc(sVar6 + 5);
  tv_test_start = tutil_tvnow();
  if (pcVar7 == (char *)0x0) {
    fwrite("Not enough memory for full url\n",0x1f,1,_stderr);
    uVar3 = 0x1b;
  }
  else {
    ppCVar8 = easy;
    for (lVar13 = 0; lVar13 != 0xc; lVar13 = lVar13 + 4) {
      *ppCVar8 = (CURL *)0x0;
      *(undefined4 *)((long)sockets + lVar13) = 0xffffffff;
      ppCVar8 = ppCVar8 + 1;
    }
    res = 0;
    uVar3 = curl_global_init(3);
    pFVar18 = _stderr;
    if (uVar3 == 0) {
      uVar3 = res;
      if (res == 0) {
        lVar13 = curl_multi_init();
        if (lVar13 == 0) {
          fprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                  ,0x72);
          res = 0x7b;
        }
        else if (res == 0) {
          cVar19 = '\0';
          local_1d8 = 0;
          local_1d0 = pcVar7;
LAB_001023bb:
          do {
            timeout = -99;
            maxfd = -1;
            if (cVar19 == '\0') {
              pCVar9 = (CURL *)curl_easy_init();
              easy[(int)local_1d8] = pCVar9;
              if (pCVar9 == (CURL *)0x0) {
                fprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                        ,0x7f);
                res = 0x7c;
                pcVar7 = local_1d0;
              }
              else {
                pcVar7 = local_1d0;
                if (res == 0) {
                  ppCVar8 = easy + (int)local_1d8;
                  if ((int)local_1d8 % 3 == 2) {
                    sprintf(local_1d0,"%s0200",url);
                    uVar3 = curl_easy_setopt(*ppCVar8,0x6b,8);
                    pFVar18 = _stderr;
                    if (uVar3 == 0) {
LAB_00102475:
                      pcVar7 = local_1d0;
                      if (res != 0) break;
                      uVar3 = curl_easy_setopt(*ppCVar8,0x4a,1);
                      pFVar18 = _stderr;
                      if (uVar3 == 0) {
                        pcVar7 = local_1d0;
                        if (res != 0) break;
                        uVar3 = curl_easy_setopt(*ppCVar8,0x2712,local_1d0);
                        pFVar18 = _stderr;
                        if (uVar3 == 0) {
                          pcVar7 = local_1d0;
                          if (res != 0) break;
                          uVar3 = curl_easy_setopt(*ppCVar8,0x29,1);
                          pFVar18 = _stderr;
                          if (uVar3 == 0) {
                            pcVar7 = local_1d0;
                            if (res != 0) break;
                            uVar3 = curl_easy_setopt(*ppCVar8,0x50,1);
                            pFVar18 = _stderr;
                            if (uVar3 == 0) {
                              pcVar7 = local_1d0;
                              if (res != 0) break;
                              uVar3 = curl_easy_setopt(*ppCVar8,0x2715,"testuser:testpass");
                              pFVar18 = _stderr;
                              if (uVar3 == 0) {
                                pcVar7 = local_1d0;
                                if (res != 0) break;
                                uVar3 = curl_easy_setopt(*ppCVar8,0x4e2b,callback);
                                pFVar18 = _stderr;
                                if (uVar3 == 0) {
                                  pcVar7 = local_1d0;
                                  if (res != 0) break;
                                  uVar3 = curl_easy_setopt(*ppCVar8,0x2711,ppCVar8);
                                  pFVar18 = _stderr;
                                  if (uVar3 == 0) {
                                    pcVar7 = local_1d0;
                                    if (res != 0) break;
                                    uVar3 = curl_easy_setopt(*ppCVar8,0x2a,1);
                                    pFVar18 = _stderr;
                                    if (uVar3 == 0) {
                                      pcVar7 = local_1d0;
                                      if (res != 0) break;
                                      uVar3 = curl_multi_add_handle(lVar13,*ppCVar8);
                                      pFVar18 = _stderr;
                                      if (uVar3 == 0) {
                                        pcVar7 = local_1d0;
                                        if (res == 0) {
                                          local_1d8 = (ulong)((int)local_1d8 + 1);
                                          cVar19 = '\x01';
                                          goto LAB_001025f5;
                                        }
                                        break;
                                      }
                                      uVar17 = (ulong)uVar3;
                                      uVar12 = curl_multi_strerror(uVar3);
                                      pcVar7 = 
                                      "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
                                      uVar14 = 0x91;
                                    }
                                    else {
                                      uVar17 = (ulong)uVar3;
                                      uVar12 = curl_easy_strerror(uVar3);
                                      pcVar7 = 
                                      "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                                      uVar14 = 0x8f;
                                    }
                                  }
                                  else {
                                    uVar17 = (ulong)uVar3;
                                    uVar12 = curl_easy_strerror(uVar3);
                                    pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                                    uVar14 = 0x8e;
                                  }
                                }
                                else {
                                  uVar17 = (ulong)uVar3;
                                  uVar12 = curl_easy_strerror(uVar3);
                                  pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                                  uVar14 = 0x8d;
                                }
                              }
                              else {
                                uVar17 = (ulong)uVar3;
                                uVar12 = curl_easy_strerror(uVar3);
                                pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                                uVar14 = 0x8c;
                              }
                            }
                            else {
                              uVar17 = (ulong)uVar3;
                              uVar12 = curl_easy_strerror(uVar3);
                              pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                              uVar14 = 0x8b;
                            }
                          }
                          else {
                            uVar17 = (ulong)uVar3;
                            uVar12 = curl_easy_strerror(uVar3);
                            pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                            uVar14 = 0x8a;
                          }
                        }
                        else {
                          uVar17 = (ulong)uVar3;
                          uVar12 = curl_easy_strerror(uVar3);
                          pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                          uVar14 = 0x89;
                        }
                      }
                      else {
                        uVar17 = (ulong)uVar3;
                        uVar12 = curl_easy_strerror(uVar3);
                        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                        uVar14 = 0x88;
                      }
                    }
                    else {
                      uVar17 = (ulong)uVar3;
                      uVar12 = curl_easy_strerror(uVar3);
                      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                      uVar14 = 0x83;
                    }
                  }
                  else {
                    sprintf(local_1d0,"%s0100",url);
                    uVar3 = curl_easy_setopt(*ppCVar8,0x6b,1);
                    pFVar18 = _stderr;
                    if (uVar3 == 0) goto LAB_00102475;
                    uVar17 = (ulong)uVar3;
                    uVar12 = curl_easy_strerror(uVar3);
                    pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                    uVar14 = 0x86;
                  }
LAB_00102d4b:
                  fprintf(pFVar18,pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                          ,uVar14,uVar17,uVar12);
                  pcVar7 = local_1d0;
                  res = (int)uVar17;
                }
              }
              break;
            }
LAB_001025f5:
            uVar3 = curl_multi_perform(lVar13,&running);
            pFVar18 = _stderr;
            if (uVar3 != 0) {
              uVar17 = (ulong)uVar3;
              uVar12 = curl_multi_strerror(uVar3);
              pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
              uVar14 = 0x96;
              goto LAB_00102d4b;
            }
            if (running < 0) {
              pcVar7 = 
              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
              ;
              uVar12 = 0x96;
LAB_00102a5f:
              fprintf(_stderr,pcVar7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,uVar12);
              res = 0x7a;
              pcVar7 = local_1d0;
              break;
            }
            pcVar7 = local_1d0;
            if (res != 0) break;
            tVar21 = tutil_tvnow();
            lVar15 = tutil_tvdiff(tVar21,tv_test_start);
            if (5000 < lVar15) {
              uVar12 = 0x9a;
LAB_00102b28:
              fprintf(_stderr,
                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,uVar12);
              res = 0x7d;
              pcVar7 = local_1d0;
              break;
            }
            pcVar7 = local_1d0;
            if ((res != 0) || ((cVar19 == '\x02' && (running == 0)))) break;
            for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
              fdread.__fds_bits[lVar15] = 0;
            }
            for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
              fdwrite.__fds_bits[lVar15] = 0;
            }
            for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
              fdexcep.__fds_bits[lVar15] = 0;
            }
            uVar3 = curl_multi_fdset(lVar13,&fdread,&fdwrite,&fdexcep,&maxfd);
            pFVar18 = _stderr;
            if (uVar3 != 0) {
              uVar17 = (ulong)uVar3;
              uVar12 = curl_multi_strerror(uVar3);
              pcVar7 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
              uVar14 = 0xa3;
              goto LAB_00102d4b;
            }
            if (maxfd < -1) {
              pcVar7 = 
              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
              uVar12 = 0xa3;
              goto LAB_00102a5f;
            }
            pcVar7 = local_1d0;
            if (res != 0) break;
            iVar5 = (int)local_1d8;
            uVar3 = iVar5 - 1;
            bVar2 = false;
            uVar17 = 0;
            if (0 < iVar5) {
              uVar17 = local_1d8 & 0xffffffff;
            }
            uVar10 = 0;
            while (uVar4 = (uint)uVar10, (int)uVar4 <= maxfd) {
              if (((ulong)fdread.__fds_bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0) {
                lVar15 = 0;
                do {
                  if (uVar17 * 4 == lVar15) {
                    if ((cVar19 != '\x01') || (bVar2)) {
                      fwrite("Unexpected new socket\n",0x16,1,_stderr);
                    }
                    else {
                      uVar1 = sockets[(int)uVar3];
                      if (uVar1 == 0xffffffff) {
                        sockets[(int)uVar3] = uVar4;
                        bVar2 = true;
                        break;
                      }
                      if (uVar4 == uVar1) {
                        __assert_fail("curfd != sockets[num_handles-1]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                                      ,0xc4,"int test(char *)");
                      }
                      fprintf(_stderr,"Handle %d wrote to socket %d then detected on %d\n",
                              (ulong)uVar3,(ulong)uVar1,uVar10);
                    }
                    res = 0x7e;
                    pcVar7 = local_1d0;
                    goto LAB_00102d63;
                  }
                  puVar11 = (uint *)((long)sockets + lVar15);
                  lVar15 = lVar15 + 4;
                } while (*puVar11 != uVar4);
              }
              uVar10 = (ulong)(uVar4 + 1);
            }
            bVar20 = cVar19 == '\x01';
            cVar19 = '\x02';
            if (bVar20) {
              if ((maxfd != -1) && (!bVar2)) {
                fwrite("Warning: socket did not open immediately for new handle (trying again)\n",
                       0x47,1,_stderr);
                cVar19 = '\x01';
                goto LAB_001023bb;
              }
              cVar19 = (2 < iVar5) * '\x02';
            }
            uVar3 = curl_multi_timeout(lVar13,&timeout);
            pFVar18 = _stderr;
            if (uVar3 != 0) {
              uVar17 = (ulong)uVar3;
              uVar12 = curl_multi_strerror(uVar3);
              pcVar7 = "%s:%d curl_multi_timeout() failed, with code %d (%s)\n";
              uVar14 = 0xdb;
              goto LAB_00102d4b;
            }
            if (timeout < -1) {
              fprintf(_stderr,
                      "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,0xdb,timeout);
              res = 0x73;
              pcVar7 = local_1d0;
              break;
            }
            pcVar7 = local_1d0;
            if (res != 0) break;
            iVar5 = (int)local_1d8;
            fprintf(_stderr,"%s:%d num_handles %d timeout %ld\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                    ,0xe0,local_1d8 & 0xffffffff);
            if (timeout == -1) {
              interval.tv_sec = 6;
              interval.tv_usec = 0;
              pcVar7 = local_1d0;
              if (iVar5 == 3 && running == 0) break;
            }
            else {
              interval.tv_sec = timeout / 1000;
              interval.tv_usec = (timeout % 1000) * 1000;
            }
            iVar5 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&interval);
            if (iVar5 == -1) {
              puVar11 = (uint *)__errno_location();
              pFVar18 = _stderr;
              uVar3 = *puVar11;
              pcVar7 = strerror(uVar3);
              fprintf(pFVar18,"%s:%d select() failed, with errno %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,0xf2,(ulong)uVar3,pcVar7);
              res = 0x79;
              pcVar7 = local_1d0;
              break;
            }
            pcVar7 = local_1d0;
            if (res != 0) break;
            tVar21 = tutil_tvnow();
            lVar15 = tutil_tvdiff(tVar21,tv_test_start);
            if (5000 < lVar15) {
              uVar12 = 0xf4;
              goto LAB_00102b28;
            }
            pcVar7 = local_1d0;
          } while (res == 0);
        }
LAB_00102d63:
        for (lVar15 = 0; lVar15 != 0x18; lVar15 = lVar15 + 8) {
          lVar16 = *(long *)((long)easy + lVar15);
          if (lVar16 != 0) {
            if (lVar13 != 0) {
              curl_multi_remove_handle(lVar13);
              lVar16 = *(long *)((long)easy + lVar15);
            }
            curl_easy_cleanup(lVar16);
          }
        }
        if (lVar13 != 0) {
          curl_multi_cleanup(lVar13);
        }
        curl_global_cleanup();
        free(pcVar7);
        uVar3 = res;
      }
    }
    else {
      uVar12 = curl_easy_strerror(uVar3);
      fprintf(pFVar18,"%s:%d curl_global_init() failed, with code %d (%s)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
              ,0x6d,(ulong)uVar3,uVar12);
      res = uVar3;
    }
  }
  return uVar3;
}

Assistant:

int test(char *url)
{
  CURLM *multi = NULL;
  int running;
  int i, j;
  int num_handles = 0;
  enum HandleState state = ReadyForNewHandle;
  char* full_url = malloc(strlen(url) + 4 + 1);

  start_test_timing();

  if (!full_url) {
    fprintf(stderr, "Not enough memory for full url\n");
    return CURLE_OUT_OF_MEMORY;
  }

  for (i = 0; i < MAX_EASY_HANDLES; ++i) {
    easy[i] = NULL;
    sockets[i] = -1;
  }

  res = 0;
  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    return res;
  }

  multi_init(multi);

  for(;;) {
    struct timeval interval;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    long timeout = -99;
    curl_socket_t curfd, maxfd = INVALID_SOCKET;
    bool found_new_socket = FALSE;

    /* Start a new handle if we aren't at the max */
    if (state == ReadyForNewHandle) {
      easy_init(easy[num_handles]);

      if (num_handles % 3 == 2) {
        sprintf(full_url, "%s0200", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_NTLM);
      } else {
        sprintf(full_url, "%s0100", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
      }
      easy_setopt(easy[num_handles], CURLOPT_FRESH_CONNECT, 1L);
      easy_setopt(easy[num_handles], CURLOPT_URL, full_url);
      easy_setopt(easy[num_handles], CURLOPT_VERBOSE, 1L);
      easy_setopt(easy[num_handles], CURLOPT_HTTPGET, 1L);
      easy_setopt(easy[num_handles], CURLOPT_USERPWD, "testuser:testpass");
      easy_setopt(easy[num_handles], CURLOPT_WRITEFUNCTION, callback);
      easy_setopt(easy[num_handles], CURLOPT_WRITEDATA, easy + num_handles);
      easy_setopt(easy[num_handles], CURLOPT_HEADER, 1L);

      multi_add_handle(multi, easy[num_handles]);
      num_handles += 1;
      state = NeedSocketForNewHandle;
    }

    multi_perform(multi, &running);
    if (0 != res)
      break;

    abort_on_test_timeout();

    if(!running && state == NoMoreHandles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, (int *)&maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    /* Any socket which is new in fdread is associated with the new handle */
    for (curfd = 0; curfd <= maxfd; ++curfd) {
      bool socket_exists = FALSE;
      if (!FD_ISSET(curfd, &fdread)) {
        continue;
      }

      /* Check if this socket was already detected for an earlier handle (or
         for this handle, num_handles-1, in the callback */
      for (j = 0; j < num_handles; ++j) {
        if (sockets[j] == curfd) {
          socket_exists = TRUE;
          break;
        }
      }
      if (socket_exists) {
        continue;
      }

      if (found_new_socket || state != NeedSocketForNewHandle) {
        fprintf(stderr, "Unexpected new socket\n");
        res = TEST_ERR_MAJOR_BAD;
        goto test_cleanup;
      }

      /* Now we know the socket is for the most recent handle, num_handles-1 */
      if (sockets[num_handles-1] != INVALID_SOCKET) {
        /* A socket for this handle was already detected in the callback; if it
           matched socket_exists should be true and we would never get here */
        assert(curfd != sockets[num_handles-1]);
        fprintf(stderr, "Handle %d wrote to socket %d then detected on %d\n",
                num_handles-1, sockets[num_handles-1], curfd);
        res = TEST_ERR_MAJOR_BAD;
        goto test_cleanup;
      }
      else {
        sockets[num_handles-1] = curfd;
        found_new_socket = TRUE;
        /* continue to make sure there's only one new handle */
      }
    }

    if (state == NeedSocketForNewHandle) {
      if(maxfd != -1 && !found_new_socket) {
        fprintf(stderr, "Warning: socket did not open immediately for new "
                "handle (trying again)\n");
        continue;
      }
      state = num_handles < MAX_EASY_HANDLES ? ReadyForNewHandle
                                             : NoMoreHandles;
    }

    multi_timeout(multi, &timeout);

    /* At this point, timeout is guaranteed to be greater or equal than -1. */

    fprintf(stderr, "%s:%d num_handles %d timeout %ld\n",
            __FILE__, __LINE__, num_handles, timeout);

    if(timeout != -1L) {
      interval.tv_sec = timeout/1000;
      interval.tv_usec = (timeout%1000)*1000;
    }
    else {
      interval.tv_sec = TEST_HANG_TIMEOUT/1000+1;
      interval.tv_usec = 0;

      /* if there's no timeout and we get here on the last handle, we may
         already have read the last part of the stream so waiting makes no
         sense */
      if(!running && num_handles == MAX_EASY_HANDLES) {
        break;
      }
    }

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  for (i = 0; i < MAX_EASY_HANDLES; ++i) {
    if (easy[i]) {
       if (multi) {
         curl_multi_remove_handle(multi, easy[i]);
       }
       curl_easy_cleanup(easy[i]);
    }
  }

  if (multi) {
    curl_multi_cleanup(multi);
  }

  curl_global_cleanup();

  if (full_url) {
    free(full_url);
  }

  return res;
}